

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O1

bool dxil_spv::emit_pack4x8_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  Id IVar2;
  Id IVar3;
  uint uVar4;
  Builder *this;
  Value *pVVar5;
  Type *type;
  Operation *pOVar6;
  Operation *this_00;
  uint i;
  long lVar7;
  bool bVar8;
  uint32_t clamp_op_literal;
  Vector<spv::Id> lo_ids;
  Id elements [4];
  Vector<spv::Id> hi_ids;
  uint32_t local_8c;
  Type *local_88;
  Id local_7c;
  Vector<Id> local_78;
  Id local_58 [4];
  Vector<Id> local_48;
  
  this = Converter::Impl::builder(impl);
  local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_78.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0x27);
  std::
  _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
  ::_M_insert_unique<spv::Capability_const&>
            ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
              *)&this->capabilities,(Capability *)&local_78);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  type = LLVMBC::Value::getType(pVVar5);
  IVar2 = Converter::Impl::get_type_id(impl,type,0);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,&local_8c);
  if (bVar1) {
    lVar7 = 0;
    local_88 = type;
    do {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,(int)lVar7 + 2);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      local_58[lVar7] = IVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    IVar2 = Converter::Impl::build_vector(impl,IVar2,local_58,4);
    if (local_8c != 0) {
      if (impl->glsl_std450_ext == 0) {
        IVar3 = spv::Builder::import(this,"GLSL.std.450");
        impl->glsl_std450_ext = IVar3;
      }
      local_7c = IVar2;
      uVar4 = LLVMBC::Type::getIntegerBitWidth(local_88);
      if (uVar4 == 0x10) {
        bVar8 = local_8c == 1;
        IVar2 = spv::Builder::makeIntegerType(this,0x10,true);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,(uint)bVar8 * 0x80 - 0x80,false);
        IVar3 = spv::Builder::makeIntegerType(this,0x10,true);
      }
      else {
        bVar8 = local_8c == 1;
        IVar2 = spv::Builder::makeIntegerType(this,0x20,true);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,(uint)bVar8 * 0x80 - 0x80,false);
        IVar3 = spv::Builder::makeIntegerType(this,0x20,true);
      }
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,(uint)(local_8c == 1) << 7 | 0x7f,false);
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x10);
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 4;
      *local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar2;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[1] = IVar2;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar2;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = IVar2;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x10);
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 4;
      *local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar3;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[1] = IVar3;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar3;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = IVar3;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      uVar4 = LLVMBC::Type::getIntegerBitWidth(local_88);
      IVar2 = spv::Builder::makeIntegerType(this,uVar4,true);
      IVar2 = spv::Builder::makeVectorType(this,IVar2,4);
      IVar3 = spv::Builder::makeCompositeConstant(this,IVar2,&local_78,false);
      local_88 = (Type *)CONCAT44(local_88._4_4_,IVar3);
      IVar3 = spv::Builder::makeCompositeConstant(this,IVar2,&local_48,false);
      pOVar6 = Converter::Impl::allocate(impl,OpExtInst,IVar2);
      Operation::add_id(pOVar6,impl->glsl_std450_ext);
      Operation::add_literal(pOVar6,0x2d);
      Operation::add_id(pOVar6,local_7c);
      Operation::add_id(pOVar6,(Id)local_88);
      Operation::add_id(pOVar6,IVar3);
      Converter::Impl::add(impl,pOVar6,false);
      IVar2 = pOVar6->id;
      if (local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_48.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_78.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    IVar3 = spv::Builder::makeIntegerType(this,8,false);
    IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
    pOVar6 = Converter::Impl::allocate(impl,OpUConvert,IVar3);
    Operation::add_id(pOVar6,IVar2);
    Converter::Impl::add(impl,pOVar6,false);
    this_00 = Converter::Impl::allocate(impl,OpBitcast,(Value *)instruction);
    Operation::add_id(this_00,pOVar6->id);
    Converter::Impl::add(impl,this_00,false);
  }
  return bVar1;
}

Assistant:

bool emit_pack4x8_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityInt8);

	auto *element_type = instruction->getOperand(2)->getType();
	spv::Id uint_type = impl.get_type_id(element_type);

	uint32_t clamp_op_literal;
	if (!get_constant_operand(instruction, 1, &clamp_op_literal))
		return false;

	spv::Id elements[4];
	for (unsigned i = 0; i < 4; i++)
		elements[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id vec_id = impl.build_vector(uint_type, elements, 4);
	if (clamp_op_literal != 0)
	{
		// Signed saturate with u8 range or s8 range.
		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		spv::Id lo_id, hi_id;
		if (element_type->getIntegerBitWidth() == 16)
		{
			lo_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 255 : 127);
		}
		else
		{
			lo_id = builder.makeIntConstant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeIntConstant(clamp_op_literal == 1 ? 255 : 127);
		}

		Vector<spv::Id> lo_ids = { lo_id, lo_id, lo_id, lo_id };
		Vector<spv::Id> hi_ids = { hi_id, hi_id, hi_id, hi_id };

		spv::Id int_type = builder.makeIntType(element_type->getIntegerBitWidth());
		spv::Id int4_type = builder.makeVectorType(int_type, 4);
		lo_id = builder.makeCompositeConstant(int4_type, lo_ids);
		hi_id = builder.makeCompositeConstant(int4_type, hi_ids);

		auto *clamp_op = impl.allocate(spv::OpExtInst, int4_type);
		clamp_op->add_id(impl.glsl_std450_ext);
		clamp_op->add_literal(GLSLstd450SClamp);
		clamp_op->add_id(vec_id);
		clamp_op->add_id(lo_id);
		clamp_op->add_id(hi_id);
		impl.add(clamp_op);
		vec_id = clamp_op->id;
	}

	auto *narrow_op = impl.allocate(spv::OpUConvert, builder.makeVectorType(builder.makeUintType(8), 4));
	narrow_op->add_id(vec_id);
	impl.add(narrow_op);

	auto *bitcast_op = impl.allocate(spv::OpBitcast, instruction);
	bitcast_op->add_id(narrow_op->id);
	impl.add(bitcast_op);

	return true;
}